

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O2

size_t __thiscall zmq::msg_t::size(msg_t *this)

{
  uchar uVar1;
  size_t sVar2;
  
  uVar1 = (this->_u).base.type;
  if (6 < (byte)(uVar1 + 0x9b)) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","check ()",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/msg.cpp"
            ,0x19e);
    fflush(_stderr);
    zmq_abort("check ()");
    uVar1 = (this->_u).base.type;
  }
  switch(uVar1) {
  case 'e':
    sVar2 = (size_t)(this->_u).base.unused[0x21];
    break;
  case 'f':
  case 'i':
    sVar2 = ((this->_u).lmsg.content)->size;
    break;
  default:
    sVar2 = 0;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","false",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/msg.cpp"
            ,0x1aa);
    fflush(_stderr);
    zmq_abort("false");
    break;
  case 'h':
    sVar2 = (this->_u).cmsg.size;
  }
  return sVar2;
}

Assistant:

size_t zmq::msg_t::size () const
{
    //  Check the validity of the message.
    zmq_assert (check ());

    switch (_u.base.type) {
        case type_vsm:
            return _u.vsm.size;
        case type_lmsg:
            return _u.lmsg.content->size;
        case type_zclmsg:
            return _u.zclmsg.content->size;
        case type_cmsg:
            return _u.cmsg.size;
        default:
            zmq_assert (false);
            return 0;
    }
}